

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ptr<Expression> __thiscall Parser::unary(Parser *this)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Parser *in_RSI;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  ptr<Expression> pVar3;
  __shared_ptr<New,_(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  bVar1 = match(in_RSI,Neg);
  if (bVar1) {
    consume(in_RSI);
    unary((Parser *)&stack0xffffffffffffffd8);
    std::make_shared<Negation,std::shared_ptr<Expression>&>((shared_ptr<Expression> *)&local_38);
LAB_0010df99:
    _Var2._M_pi = local_38._M_refcount._M_pi;
    local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->filepath)._M_dataplus._M_p = (pointer)local_38._M_ptr;
    (this->filepath)._M_string_length = (size_type)_Var2._M_pi;
    local_38._M_ptr = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0;
  }
  else {
    bVar1 = match(in_RSI,Minus);
    if (bVar1) {
      consume(in_RSI);
      unary((Parser *)&stack0xffffffffffffffd8);
      std::make_shared<Negative,std::shared_ptr<Expression>&>((shared_ptr<Expression> *)&local_38);
      goto LAB_0010df99;
    }
    bVar1 = match(in_RSI,New);
    if (!bVar1) {
      pVar3 = primary(this);
      _Var2 = pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      goto LAB_0010dfbd;
    }
    consume(in_RSI);
    primary(this);
    std::make_shared<New,std::shared_ptr<Expression>&>((shared_ptr<Expression> *)&local_38);
    std::__shared_ptr<Expression,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Expression,(__gnu_cxx::_Lock_policy)2> *)this,&local_38);
    this_00 = &local_38._M_refcount;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  _Var2._M_pi = extraout_RDX;
LAB_0010dfbd:
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::unary() {
    if(match(TokenType::Neg)) {
        consume();
        return make<Negation>(unary());
    }

    if(match(TokenType::Minus)) {
        consume();
        return make<Negative>(unary());
    }

    bool isNew = false;
    if(match(TokenType::New)) {
        consume();
        isNew = true;
    }

    ptr<Expression> expr = primary();

    if(isNew) {
        expr = make<New>(expr);
    }

    return expr;
}